

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O0

QDataStream * operator<<(QDataStream *s,QRectF *r)

{
  QDataStream *f;
  QRectF *in_RSI;
  QDataStream *in_RDI;
  QDataStream *this;
  double in_stack_ffffffffffffffe8;
  
  this = in_RDI;
  QRectF::x(in_RSI);
  QDataStream::operator<<(this,in_stack_ffffffffffffffe8);
  QRectF::y(in_RSI);
  QDataStream::operator<<(this,in_stack_ffffffffffffffe8);
  QRectF::width(in_RSI);
  f = QDataStream::operator<<(this,in_stack_ffffffffffffffe8);
  QRectF::height(in_RSI);
  QDataStream::operator<<(this,(double)f);
  return in_RDI;
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QRectF &r)
{
    s << double(r.x()) << double(r.y()) << double(r.width()) << double(r.height());
    return s;
}